

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

cl_context
xmrig::OclLib::createContext
          (cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
          _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
          cl_int *errcode_ret)

{
  cl_context p_Var1;
  char *pcVar2;
  
  p_Var1 = (*pCreateContext)(properties,num_devices,devices,pfn_notify,user_data,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_context)0x0;
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar2,"clCreateContext");
  }
  return p_Var1;
}

Assistant:

cl_context xmrig::OclLib::createContext(const cl_context_properties *properties, cl_uint num_devices, const cl_device_id *devices, void (CL_CALLBACK *pfn_notify)(const char *, const void *, size_t, void *), void *user_data, cl_int *errcode_ret)
{
    assert(pCreateContext != nullptr);

    auto result = pCreateContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateContext);

        return nullptr;
    }

    return result;
}